

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int checkTestFile(char *filename)

{
  int iVar1;
  stat buf;
  stat64 sStack_98;
  
  iVar1 = stat64(filename,&sStack_98);
  return (int)((sStack_98.st_mode & 0xf000) == 0x8000 && iVar1 != -1);
}

Assistant:

static int checkTestFile(const char *filename) {
    struct stat buf;

    if (stat(filename, &buf) == -1)
        return(0);

#if defined(_WIN32)
    if (!(buf.st_mode & _S_IFREG))
        return(0);
#else
    if (!S_ISREG(buf.st_mode))
        return(0);
#endif

    return(1);
}